

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMNodeImpl::release(DOMNodeImpl *this)

{
  DOMException *this_00;
  DOMDocument *pDVar1;
  MemoryManager *local_68;
  DOMDocumentImpl *local_58;
  DOMNode *local_48;
  MemoryManager *local_38;
  DOMNodeImpl *this_local;
  
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this == (DOMNodeImpl *)0x0) {
    local_38 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    pDVar1 = getOwnerDocument(this);
    if (pDVar1 == (DOMDocument *)0x0) {
      local_48 = (DOMNode *)0x0;
    }
    else {
      local_48 = &pDVar1[-1].super_DOMNode;
    }
    if (local_48 == (DOMNode *)0x0) {
      local_68 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pDVar1 = getOwnerDocument(this);
      if (pDVar1 == (DOMDocument *)0x0) {
        local_58 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_58 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
      }
      local_68 = DOMDocumentImpl::getMemoryManager(local_58);
    }
    local_38 = local_68;
  }
  DOMException::DOMException(this_00,0xf,0,local_38);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMNodeImpl::release()
{
    // shouldn't reach here
    throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);
}